

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::add_sample
          (TypedTimeSamples<tinyusdz::value::point3f> *this,double t,point3f *v)

{
  pointer *ppSVar1;
  iterator __position;
  undefined4 uVar2;
  Sample s;
  Sample local_20;
  
  uVar2 = local_20._20_4_;
  local_20._20_4_ = local_20._20_4_ & 0xffffff00;
  local_20.value.z = v->z;
  local_20.value.x = v->x;
  local_20.value.y = v->y;
  __position._M_current =
       (this->_samples).
       super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.t = t;
    ::std::
    vector<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>>
    ::_M_realloc_insert<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample&>
              ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>>
                *)this,__position,&local_20);
  }
  else {
    *(ulong *)&((__position._M_current)->value).z =
         CONCAT44(uVar2,local_20.value.z) & 0xffffff00ffffffff;
    (__position._M_current)->t = t;
    ((__position._M_current)->value).x = local_20.value.x;
    ((__position._M_current)->value).y = local_20.value.y;
    ppSVar1 = &(this->_samples).
               super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }